

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromaclique.cpp
# Opt level: O3

bool read_mean_and_sd(string *filename,double *mean,double *sd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  istream *piVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string line;
  tokenizer_t tokenizer;
  char_separator<char,_std::char_traits<char>_> whitespace_separator;
  ifstream in;
  double local_438;
  undefined **local_430;
  type_info_t *local_428;
  type_info_t *local_420;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  tokenizer<boost::char_separator<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  char_separator<char,_std::char_traits<char>_> local_380;
  iter local_330;
  iter local_2a8;
  long local_220 [4];
  byte abStack_200 [488];
  
  boost::char_separator<char,_std::char_traits<char>_>::char_separator
            (&local_380," \t",(char *)0x0,drop_empty_tokens);
  std::ifstream::ifstream(local_220,(filename->_M_dataplus)._M_p,_S_in);
  paVar1 = &local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  local_400._M_dataplus._M_p = (pointer)paVar1;
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    cVar2 = std::ios::widen((char)&local_438 + (char)*(long *)(local_220[0] + -0x18) + '\x18');
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_220,(string *)&local_400,cVar2);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
      boost::
      tokenizer<boost::char_separator<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string>
      ::tokenizer<std::__cxx11::string>
                ((tokenizer<boost::char_separator<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string>
                  *)&local_3e0,&local_400,&local_380);
      boost::
      tokenizer<boost::char_separator<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::begin(&local_2a8,&local_3e0);
      boost::
      tokenizer<boost::char_separator<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::end(&local_330,&local_3e0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<boost::token_iterator<boost::char_separator<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_418,
                 &local_2a8,&local_330,(allocator_type *)&local_430);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330.tok_._M_dataplus._M_p != &local_330.tok_.field_2) {
        operator_delete(local_330.tok_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330.f_.m_dropped_delims._M_dataplus._M_p !=
          &local_330.f_.m_dropped_delims.field_2) {
        operator_delete(local_330.f_.m_dropped_delims._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330.f_.m_kept_delims._M_dataplus._M_p != &local_330.f_.m_kept_delims.field_2) {
        operator_delete(local_330.f_.m_kept_delims._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8.tok_._M_dataplus._M_p != &local_2a8.tok_.field_2) {
        operator_delete(local_2a8.tok_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8.f_.m_dropped_delims._M_dataplus._M_p !=
          &local_2a8.f_.m_dropped_delims.field_2) {
        operator_delete(local_2a8.f_.m_dropped_delims._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8.f_.m_kept_delims._M_dataplus._M_p != &local_2a8.f_.m_kept_delims.field_2) {
        operator_delete(local_2a8.f_.m_kept_delims._M_dataplus._M_p);
      }
      if ((long)local_418.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_418.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x40) {
        local_438 = 0.0;
        local_430 = (undefined **)
                    ((local_418.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        local_428 = (type_info_t *)
                    ((long)local_430 +
                    (local_418.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        bVar3 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                float_types_converter_internal<double>
                          ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_430,
                           &local_438);
        if (!bVar3) {
          local_430 = &PTR__bad_cast_001b7b88;
          local_428 = (type_info_t *)&std::__cxx11::string::typeinfo;
          local_420 = (type_info_t *)&double::typeinfo;
          boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_430);
        }
        *mean = local_438;
        local_438 = 0.0;
        local_430 = (undefined **)
                    local_418.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        local_428 = (type_info_t *)
                    ((long)local_430 +
                    local_418.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        bVar3 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
                float_types_converter_internal<double>
                          ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_430,
                           &local_438);
        if (!bVar3) {
          local_430 = &PTR__bad_cast_001b7b88;
          local_428 = (type_info_t *)&std::__cxx11::string::typeinfo;
          local_420 = (type_info_t *)&double::typeinfo;
          boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_430);
        }
        *sd = local_438;
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0.f_.m_dropped_delims._M_dataplus._M_p !=
          &local_3e0.f_.m_dropped_delims.field_2) {
        operator_delete(local_3e0.f_.m_dropped_delims._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0.f_.m_kept_delims._M_dataplus._M_p != &local_3e0.f_.m_kept_delims.field_2) {
        operator_delete(local_3e0.f_.m_kept_delims._M_dataplus._M_p);
      }
      goto LAB_00140981;
    }
  }
  bVar3 = false;
LAB_00140981:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != paVar1) {
    operator_delete(local_400._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.m_dropped_delims._M_dataplus._M_p != &local_380.m_dropped_delims.field_2) {
    operator_delete(local_380.m_dropped_delims._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.m_kept_delims._M_dataplus._M_p != &local_380.m_kept_delims.field_2) {
    operator_delete(local_380.m_kept_delims._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool read_mean_and_sd(const string& filename, double* mean, double* sd) {
    typedef boost::tokenizer<boost::char_separator<char> > tokenizer_t;
    boost::char_separator<char> whitespace_separator(" \t");
    ifstream in(filename.c_str());
    string line;
    if (in.fail() || (!getline(in,line))) {
        return false;
    }
    tokenizer_t tokenizer(line,whitespace_separator);
    vector<string> tokens(tokenizer.begin(), tokenizer.end());
    if (tokens.size() != 2) {
        return false;
    }
    try {
        *mean = boost::lexical_cast<double>(tokens[0]);
        *sd = boost::lexical_cast<double>(tokens[1]);
    } catch(boost::bad_lexical_cast &){
        return false;
    }
    return true;
}